

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::InstructionFolder::UnaryOperate(InstructionFolder *this,Op opcode,uint32_t operand)

{
  if (1 < opcode - OpUConvert) {
    if (opcode == OpNot) {
      operand = ~operand;
    }
    else if (opcode == OpLogicalNot) {
      operand = (uint32_t)(operand == 0);
    }
    else {
      if (opcode != OpSNegate) {
        __assert_fail("false && \"Unsupported unary operation for OpSpecConstantOp instruction\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                      ,0x41,
                      "uint32_t spvtools::opt::InstructionFolder::UnaryOperate(spv::Op, uint32_t) const"
                     );
      }
      operand = -operand;
    }
  }
  return operand;
}

Assistant:

uint32_t InstructionFolder::UnaryOperate(spv::Op opcode,
                                         uint32_t operand) const {
  switch (opcode) {
    // Arthimetics
    case spv::Op::OpSNegate: {
      int32_t s_operand = static_cast<int32_t>(operand);
      if (s_operand == std::numeric_limits<int32_t>::min()) {
        return s_operand;
      }
      return -s_operand;
    }
    case spv::Op::OpNot:
      return ~operand;
    case spv::Op::OpLogicalNot:
      return !static_cast<bool>(operand);
    case spv::Op::OpUConvert:
      return operand;
    case spv::Op::OpSConvert:
      return operand;
    default:
      assert(false &&
             "Unsupported unary operation for OpSpecConstantOp instruction");
      return 0u;
  }
}